

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall
CLI::App::add_flag_function
          (App *this,string *flag_name,function<void_(long)> *function,string *flag_description)

{
  Option *pOVar1;
  callback_t fun;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *in_stack_fffffffffffffee8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  function<void_(long)> *in_stack_fffffffffffffef8;
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [3];
  
  __str = local_60;
  std::function<void_(long)>::function
            ((function<void_(long)> *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  ::std::
  function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>::
  function<CLI::App::add_flag_function(std::__cxx11::string,std::function<void(long)>,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)_1_,void>
            (in_stack_ffffffffffffff00,(anon_class_32_1_3a3b9956 *)in_stack_fffffffffffffef8);
  add_flag_function(std::__cxx11::string,std::function<void(long)>,std::__cxx11::string)::
  {lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)#1}::~vector
            ((anon_class_32_1_3a3b9956 *)0x40deae);
  ::std::__cxx11::string::string(in_stack_ffffffffffffff30,__str);
  this_00 = local_b0;
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)this_00,in_stack_fffffffffffffee8);
  ::std::__cxx11::string::string(in_stack_ffffffffffffff30,__str);
  pOVar1 = _add_flag_internal(this,flag_name,(callback_t *)function,flag_description);
  pOVar1 = Option::multi_option_policy(pOVar1,Sum);
  ::std::__cxx11::string::~string(this_00);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x40df37);
  ::std::__cxx11::string::~string(this_00);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::~function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
               *)0x40df51);
  return pOVar1;
}

Assistant:

CLI11_INLINE Option *
App::add_flag_function(std::string flag_name,
                       std::function<void(std::int64_t)> function,  ///< A function to call, void(int)
                       std::string flag_description) {

    CLI::callback_t fun = [function](const CLI::results_t &res) {
        using CLI::detail::lexical_cast;
        std::int64_t flag_count{0};
        lexical_cast(res[0], flag_count);
        function(flag_count);
        return true;
    };
    return _add_flag_internal(flag_name, std::move(fun), std::move(flag_description))
        ->multi_option_policy(MultiOptionPolicy::Sum);
}